

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Label __thiscall
asmjit::Assembler::newNamedLabel
          (Assembler *this,char *name,size_t nameLength,uint32_t type,uint32_t parentId)

{
  Error EVar1;
  char *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  Label LVar2;
  char *unaff_retaddr;
  uint32_t *in_stack_00000008;
  CodeHolder *in_stack_00000010;
  Error err;
  uint32_t id;
  char *in_stack_00000340;
  int in_stack_0000034c;
  char *in_stack_00000350;
  Error error;
  undefined8 in_stack_fffffffffffffff0;
  size_t in_stack_fffffffffffffff8;
  
  error = 0;
  if (*(int *)(in_RSI + 0x2c) == 0) {
    if (*(long *)(in_RSI + 0x18) == 0) {
      DebugUtils::assertionFailed(in_stack_00000350,in_stack_0000034c,in_stack_00000340);
    }
    EVar1 = CodeHolder::newNamedLabelId
                      (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                       (uint32_t)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                       (uint32_t)in_stack_fffffffffffffff0);
    if (EVar1 != 0) {
      CodeEmitter::setLastError((CodeEmitter *)CONCAT44(in_R8D,in_R9D),error,in_RSI);
    }
  }
  *in_RDI = CONCAT44(error,4);
  in_RDI[1] = 0;
  LVar2.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)0x0;
  LVar2.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)in_RDI;
  return (Label)LVar2.super_Operand.super_Operand_.field_0;
}

Assistant:

Label Assembler::newNamedLabel(const char* name, size_t nameLength, uint32_t type, uint32_t parentId) {
  uint32_t id = 0;
  if (!_lastError) {
    ASMJIT_ASSERT(_code != nullptr);
    Error err = _code->newNamedLabelId(id, name, nameLength, type, parentId);
    if (ASMJIT_UNLIKELY(err)) setLastError(err);
  }
  return Label(id);
}